

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureBorderClampTests.cpp
# Opt level: O0

bool deqp::gles31::Functional::anon_unknown_1::filterRequiresFilterability(deUint32 filter)

{
  bool local_9;
  deUint32 filter_local;
  
  if (filter == 0x2600) {
LAB_021a64bd:
    local_9 = false;
  }
  else {
    if (filter != 0x2601) {
      if (filter == 0x2700) goto LAB_021a64bd;
      if (2 < filter - 0x2701) {
        return false;
      }
    }
    local_9 = true;
  }
  return local_9;
}

Assistant:

bool filterRequiresFilterability (deUint32 filter)
{
	switch (filter)
	{
		case GL_NEAREST:
		case GL_NEAREST_MIPMAP_NEAREST:
			return false;

		case GL_LINEAR:
		case GL_LINEAR_MIPMAP_NEAREST:
		case GL_NEAREST_MIPMAP_LINEAR:
		case GL_LINEAR_MIPMAP_LINEAR:
			return true;

		default:
			DE_ASSERT(false);
			return false;
	}
}